

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# navigation.cpp
# Opt level: O0

void __thiscall despot::Navigation::Init(Navigation *this,istream *is)

{
  undefined8 this_00;
  int iVar1;
  int iVar2;
  istream *piVar3;
  void *this_01;
  NavigationState *pNVar4;
  reference ppNVar5;
  reference pvVar6;
  reference pvVar7;
  size_type sVar8;
  ulong uVar9;
  reference pvVar10;
  reference pvVar11;
  State local_1b8 [32];
  State local_198 [32];
  State local_178 [32];
  State local_158 [32];
  State local_138 [32];
  double local_118;
  double prob;
  State local_f0 [32];
  State local_d0 [32];
  State local_b0 [32];
  State local_90 [36];
  int local_6c;
  int local_68;
  int next_pos;
  int pos_1;
  int flag;
  int a;
  int s;
  int i_1;
  int i;
  int pos;
  int x;
  int y;
  string local_38 [8];
  string tok;
  istream *is_local;
  Navigation *this_local;
  
  tok.field_2._8_8_ = is;
  std::__cxx11::string::string(local_38);
  piVar3 = std::operator>>((istream *)tok.field_2._8_8_,local_38);
  piVar3 = std::operator>>(piVar3,local_38);
  this_01 = (void *)std::istream::operator>>(piVar3,&this->ysize_);
  std::istream::operator>>(this_01,&this->xsize_);
  std::vector<despot::NavigationState_*,_std::allocator<despot::NavigationState_*>_>::resize
            (&this->states_,(long)(flag_size_ * (this->xsize_ * this->ysize_ + 1)));
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::resize
            (&this->obs_,(long)(this->xsize_ * this->ysize_ + 1));
  std::vector<double,_std::allocator<double>_>::resize
            (&this->trap_prob_,(long)(this->xsize_ * this->ysize_ + 1));
  this->trap_pos_ = this->xsize_ * this->ysize_;
  for (pos = 0; pos < this->ysize_; pos = pos + 1) {
    for (i = 0; i < this->xsize_; i = i + 1) {
      i_1 = pos * this->xsize_ + i;
      for (s = 0; this_00 = tok.field_2._8_8_, s < flag_size_; s = s + 1) {
        pNVar4 = (NavigationState *)operator_new(0x20);
        NavigationState::NavigationState(pNVar4,flag_size_ * i_1 + s);
        ppNVar5 = std::vector<despot::NavigationState_*,_std::allocator<despot::NavigationState_*>_>
                  ::operator[](&this->states_,(long)(flag_size_ * i_1 + s));
        *ppNVar5 = pNVar4;
      }
      pvVar6 = std::vector<double,_std::allocator<double>_>::operator[](&this->trap_prob_,(long)i_1)
      ;
      std::istream::operator>>((void *)this_00,pvVar6);
      pvVar6 = std::vector<double,_std::allocator<double>_>::operator[](&this->trap_prob_,(long)i_1)
      ;
      if ((*pvVar6 == -1.0) && (!NAN(*pvVar6))) {
        this->goal_pos_ = i_1;
        pvVar6 = std::vector<double,_std::allocator<double>_>::operator[]
                           (&this->trap_prob_,(long)i_1);
        *pvVar6 = 0.0;
      }
      if ((pos == 0) && (i == 0)) {
        pvVar7 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                           (&this->obs_,(long)i_1);
        *pvVar7 = 0;
      }
      else if ((pos == 0) && (i == this->xsize_ + -1)) {
        pvVar7 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                           (&this->obs_,(long)i_1);
        *pvVar7 = 1;
      }
      else if ((pos == this->ysize_ + -1) && (i == 0)) {
        pvVar7 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                           (&this->obs_,(long)i_1);
        *pvVar7 = 2;
      }
      else if ((pos == this->ysize_ + -1) && (i == this->xsize_ + -1)) {
        pvVar7 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                           (&this->obs_,(long)i_1);
        *pvVar7 = 3;
      }
      else {
        pvVar7 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                           (&this->obs_,(long)i_1);
        *pvVar7 = 4;
      }
    }
  }
  pvVar7 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                     (&this->obs_,(long)this->trap_pos_);
  *pvVar7 = 4;
  pvVar6 = std::vector<double,_std::allocator<double>_>::operator[]
                     (&this->trap_prob_,(long)this->trap_pos_);
  *pvVar6 = 1.0;
  for (a = 0; a < flag_size_; a = a + 1) {
    pNVar4 = (NavigationState *)operator_new(0x20);
    NavigationState::NavigationState(pNVar4,flag_size_ * this->trap_pos_ + a);
    ppNVar5 = std::vector<despot::NavigationState_*,_std::allocator<despot::NavigationState_*>_>::
              operator[](&this->states_,(long)(flag_size_ * this->trap_pos_ + a));
    *ppNVar5 = pNVar4;
  }
  sVar8 = std::vector<despot::NavigationState_*,_std::allocator<despot::NavigationState_*>_>::size
                    (&this->states_);
  std::
  vector<std::vector<std::vector<despot::State,_std::allocator<despot::State>_>,_std::allocator<std::vector<despot::State,_std::allocator<despot::State>_>_>_>,_std::allocator<std::vector<std::vector<despot::State,_std::allocator<despot::State>_>,_std::allocator<std::vector<despot::State,_std::allocator<despot::State>_>_>_>_>_>
  ::resize(&this->transition_probabilities_,sVar8);
  for (flag = 0; uVar9 = (ulong)flag,
      sVar8 = std::vector<despot::NavigationState_*,_std::allocator<despot::NavigationState_*>_>::
              size(&this->states_), uVar9 < sVar8; flag = flag + 1) {
    pvVar10 = std::
              vector<std::vector<std::vector<despot::State,_std::allocator<despot::State>_>,_std::allocator<std::vector<despot::State,_std::allocator<despot::State>_>_>_>,_std::allocator<std::vector<std::vector<despot::State,_std::allocator<despot::State>_>,_std::allocator<std::vector<despot::State,_std::allocator<despot::State>_>_>_>_>_>
              ::operator[](&this->transition_probabilities_,(long)flag);
    iVar1 = (**(code **)(*(long *)this + 0x28))();
    std::
    vector<std::vector<despot::State,_std::allocator<despot::State>_>,_std::allocator<std::vector<despot::State,_std::allocator<despot::State>_>_>_>
    ::resize(pvVar10,(long)iVar1);
    for (pos_1 = 0; iVar1 = pos_1, iVar2 = (**(code **)(*(long *)this + 0x28))(), iVar1 < iVar2;
        pos_1 = pos_1 + 1) {
      next_pos = flag % flag_size_;
      local_68 = flag >> ((byte)flag_bits_ & 0x1f);
      local_6c = NextPosition(this,local_68,pos_1);
      if (next_pos == 0) {
        if (local_68 == 0) {
          pvVar10 = std::
                    vector<std::vector<std::vector<despot::State,_std::allocator<despot::State>_>,_std::allocator<std::vector<despot::State,_std::allocator<despot::State>_>_>_>,_std::allocator<std::vector<std::vector<despot::State,_std::allocator<despot::State>_>,_std::allocator<std::vector<despot::State,_std::allocator<despot::State>_>_>_>_>_>
                    ::operator[](&this->transition_probabilities_,(long)flag);
          pvVar11 = std::
                    vector<std::vector<despot::State,_std::allocator<despot::State>_>,_std::allocator<std::vector<despot::State,_std::allocator<despot::State>_>_>_>
                    ::operator[](pvVar10,(long)pos_1);
          despot::State::State(local_90,1,1.0);
          std::vector<despot::State,_std::allocator<despot::State>_>::push_back(pvVar11,local_90);
          despot::State::~State(local_90);
        }
        else {
          pvVar10 = std::
                    vector<std::vector<std::vector<despot::State,_std::allocator<despot::State>_>,_std::allocator<std::vector<despot::State,_std::allocator<despot::State>_>_>_>,_std::allocator<std::vector<std::vector<despot::State,_std::allocator<despot::State>_>,_std::allocator<std::vector<despot::State,_std::allocator<despot::State>_>_>_>_>_>
                    ::operator[](&this->transition_probabilities_,(long)flag);
          pvVar11 = std::
                    vector<std::vector<despot::State,_std::allocator<despot::State>_>,_std::allocator<std::vector<despot::State,_std::allocator<despot::State>_>_>_>
                    ::operator[](pvVar10,(long)pos_1);
          despot::State::State(local_b0,flag,1.0);
          std::vector<despot::State,_std::allocator<despot::State>_>::push_back(pvVar11,local_b0);
          despot::State::~State(local_b0);
        }
      }
      else if (next_pos == 1) {
        if (local_68 == 0) {
          pvVar10 = std::
                    vector<std::vector<std::vector<despot::State,_std::allocator<despot::State>_>,_std::allocator<std::vector<despot::State,_std::allocator<despot::State>_>_>_>,_std::allocator<std::vector<std::vector<despot::State,_std::allocator<despot::State>_>,_std::allocator<std::vector<despot::State,_std::allocator<despot::State>_>_>_>_>_>
                    ::operator[](&this->transition_probabilities_,(long)flag);
          pvVar11 = std::
                    vector<std::vector<despot::State,_std::allocator<despot::State>_>,_std::allocator<std::vector<despot::State,_std::allocator<despot::State>_>_>_>
                    ::operator[](pvVar10,(long)pos_1);
          despot::State::State(local_d0,flag_size_ + 3,0.49);
          std::vector<despot::State,_std::allocator<despot::State>_>::push_back(pvVar11,local_d0);
          despot::State::~State(local_d0);
          pvVar10 = std::
                    vector<std::vector<std::vector<despot::State,_std::allocator<despot::State>_>,_std::allocator<std::vector<despot::State,_std::allocator<despot::State>_>_>_>,_std::allocator<std::vector<std::vector<despot::State,_std::allocator<despot::State>_>,_std::allocator<std::vector<despot::State,_std::allocator<despot::State>_>_>_>_>_>
                    ::operator[](&this->transition_probabilities_,(long)flag);
          pvVar11 = std::
                    vector<std::vector<despot::State,_std::allocator<despot::State>_>,_std::allocator<std::vector<despot::State,_std::allocator<despot::State>_>_>_>
                    ::operator[](pvVar10,(long)pos_1);
          despot::State::State(local_f0,(this->xsize_ + -2) * flag_size_ + 7,0.51);
          std::vector<despot::State,_std::allocator<despot::State>_>::push_back(pvVar11,local_f0);
          despot::State::~State(local_f0);
        }
        else {
          pvVar10 = std::
                    vector<std::vector<std::vector<despot::State,_std::allocator<despot::State>_>,_std::allocator<std::vector<despot::State,_std::allocator<despot::State>_>_>_>,_std::allocator<std::vector<std::vector<despot::State,_std::allocator<despot::State>_>,_std::allocator<std::vector<despot::State,_std::allocator<despot::State>_>_>_>_>_>
                    ::operator[](&this->transition_probabilities_,(long)flag);
          pvVar11 = std::
                    vector<std::vector<despot::State,_std::allocator<despot::State>_>,_std::allocator<std::vector<despot::State,_std::allocator<despot::State>_>_>_>
                    ::operator[](pvVar10,(long)pos_1);
          despot::State::State((State *)&prob,flag,1.0);
          std::vector<despot::State,_std::allocator<despot::State>_>::push_back
                    (pvVar11,(value_type *)&prob);
          despot::State::~State((State *)&prob);
        }
      }
      else if ((next_pos == 3) || (next_pos == 7)) {
        pvVar6 = std::vector<double,_std::allocator<double>_>::operator[]
                           (&this->trap_prob_,(long)local_6c);
        local_118 = *pvVar6;
        if (0.0 < 1.0 - local_118) {
          pvVar10 = std::
                    vector<std::vector<std::vector<despot::State,_std::allocator<despot::State>_>,_std::allocator<std::vector<despot::State,_std::allocator<despot::State>_>_>_>,_std::allocator<std::vector<std::vector<despot::State,_std::allocator<despot::State>_>,_std::allocator<std::vector<despot::State,_std::allocator<despot::State>_>_>_>_>_>
                    ::operator[](&this->transition_probabilities_,(long)flag);
          pvVar11 = std::
                    vector<std::vector<despot::State,_std::allocator<despot::State>_>,_std::allocator<std::vector<despot::State,_std::allocator<despot::State>_>_>_>
                    ::operator[](pvVar10,(long)pos_1);
          despot::State::State(local_138,local_6c * flag_size_ + 3,(1.0 - local_118) * 0.49);
          std::vector<despot::State,_std::allocator<despot::State>_>::push_back(pvVar11,local_138);
          despot::State::~State(local_138);
          pvVar10 = std::
                    vector<std::vector<std::vector<despot::State,_std::allocator<despot::State>_>,_std::allocator<std::vector<despot::State,_std::allocator<despot::State>_>_>_>,_std::allocator<std::vector<std::vector<despot::State,_std::allocator<despot::State>_>,_std::allocator<std::vector<despot::State,_std::allocator<despot::State>_>_>_>_>_>
                    ::operator[](&this->transition_probabilities_,(long)flag);
          pvVar11 = std::
                    vector<std::vector<despot::State,_std::allocator<despot::State>_>,_std::allocator<std::vector<despot::State,_std::allocator<despot::State>_>_>_>
                    ::operator[](pvVar10,(long)pos_1);
          despot::State::State(local_158,local_6c * flag_size_ + 7,(1.0 - local_118) * 0.51);
          std::vector<despot::State,_std::allocator<despot::State>_>::push_back(pvVar11,local_158);
          despot::State::~State(local_158);
        }
        if (0.0 < local_118) {
          pvVar10 = std::
                    vector<std::vector<std::vector<despot::State,_std::allocator<despot::State>_>,_std::allocator<std::vector<despot::State,_std::allocator<despot::State>_>_>_>,_std::allocator<std::vector<std::vector<despot::State,_std::allocator<despot::State>_>,_std::allocator<std::vector<despot::State,_std::allocator<despot::State>_>_>_>_>_>
                    ::operator[](&this->transition_probabilities_,(long)flag);
          pvVar11 = std::
                    vector<std::vector<despot::State,_std::allocator<despot::State>_>,_std::allocator<std::vector<despot::State,_std::allocator<despot::State>_>_>_>
                    ::operator[](pvVar10,(long)pos_1);
          despot::State::State(local_178,this->trap_pos_ * flag_size_ + 3,local_118 * 0.49);
          std::vector<despot::State,_std::allocator<despot::State>_>::push_back(pvVar11,local_178);
          despot::State::~State(local_178);
          pvVar10 = std::
                    vector<std::vector<std::vector<despot::State,_std::allocator<despot::State>_>,_std::allocator<std::vector<despot::State,_std::allocator<despot::State>_>_>_>,_std::allocator<std::vector<std::vector<despot::State,_std::allocator<despot::State>_>,_std::allocator<std::vector<despot::State,_std::allocator<despot::State>_>_>_>_>_>
                    ::operator[](&this->transition_probabilities_,(long)flag);
          pvVar11 = std::
                    vector<std::vector<despot::State,_std::allocator<despot::State>_>,_std::allocator<std::vector<despot::State,_std::allocator<despot::State>_>_>_>
                    ::operator[](pvVar10,(long)pos_1);
          despot::State::State(local_198,this->trap_pos_ * flag_size_ + 7,local_118 * 0.51);
          std::vector<despot::State,_std::allocator<despot::State>_>::push_back(pvVar11,local_198);
          despot::State::~State(local_198);
        }
      }
      else {
        pvVar10 = std::
                  vector<std::vector<std::vector<despot::State,_std::allocator<despot::State>_>,_std::allocator<std::vector<despot::State,_std::allocator<despot::State>_>_>_>,_std::allocator<std::vector<std::vector<despot::State,_std::allocator<despot::State>_>,_std::allocator<std::vector<despot::State,_std::allocator<despot::State>_>_>_>_>_>
                  ::operator[](&this->transition_probabilities_,(long)flag);
        pvVar11 = std::
                  vector<std::vector<despot::State,_std::allocator<despot::State>_>,_std::allocator<std::vector<despot::State,_std::allocator<despot::State>_>_>_>
                  ::operator[](pvVar10,(long)pos_1);
        despot::State::State(local_1b8,flag,1.0);
        std::vector<despot::State,_std::allocator<despot::State>_>::push_back(pvVar11,local_1b8);
        despot::State::~State(local_1b8);
      }
    }
  }
  std::__cxx11::string::~string(local_38);
  return;
}

Assistant:

void Navigation::Init(istream& is) {
	string tok;
	is >> tok >> tok >> ysize_ >> xsize_;
	states_.resize(flag_size_ * (xsize_ * ysize_ + 1));
	obs_.resize(xsize_ * ysize_ + 1);
	trap_prob_.resize(xsize_ * ysize_ + 1);
	trap_pos_ = xsize_ * ysize_;
	for (int y = 0; y < ysize_; y++) {
		for (int x = 0; x < xsize_; x++) {
			int pos = y * xsize_ + x;
			for (int i = 0; i < flag_size_; i++)
				states_[flag_size_ * pos + i] = new NavigationState(
					flag_size_ * pos + i);

			is >> trap_prob_[pos];

			if (trap_prob_[pos] == -1) {
				goal_pos_ = pos;
				trap_prob_[pos] = 0;
			}

			if (y == 0 && x == 0)
				obs_[pos] = 0;
			else if (y == 0 && x == xsize_ - 1)
				obs_[pos] = 1;
			else if (y == ysize_ - 1 && x == 0)
				obs_[pos] = 2;
			else if (y == ysize_ - 1 && x == xsize_ - 1)
				obs_[pos] = 3;
			else
				obs_[pos] = 4;
		}
	}
	obs_[trap_pos_] = 4;
	trap_prob_[trap_pos_] = 1.0;
	for (int i = 0; i < flag_size_; i++) {
		states_[flag_size_ * trap_pos_ + i] = new NavigationState(
			flag_size_ * trap_pos_ + i);
	}

	// Build transition matrix
	transition_probabilities_.resize(states_.size());
	for (int s = 0; s < states_.size(); s++) {
		transition_probabilities_[s].resize(NumActions());

		for (int a = 0; a < NumActions(); a++) {
			int flag = s % flag_size_;
			int pos = s >> flag_bits_;
			int next_pos = NextPosition(pos, a);

			if (flag == 0) { // Transition for first step
				if (pos == 0) {
					transition_probabilities_[s][a].push_back(State(1, 1.0));
				} else { // Self transition
					transition_probabilities_[s][a].push_back(State(s, 1.0));
				}
			} else if (flag == 1) { // Transition for second step
				if (pos == 0) {
					transition_probabilities_[s][a].push_back(
						State(3 + 1 * flag_size_, 0.49));
					transition_probabilities_[s][a].push_back(
						State(7 + (xsize_ - 2) * flag_size_, 0.51));
				} else { // Self transition
					transition_probabilities_[s][a].push_back(State(s, 1.0));
				}
			} else if (flag == 3 || flag == 7) { // Transition for remaining steps
				double prob = trap_prob_[next_pos];

				if (1 - prob > 0.0) {
					transition_probabilities_[s][a].push_back(
						State(3 + next_pos * flag_size_, (1 - prob) * 0.49));
					transition_probabilities_[s][a].push_back(
						State(7 + next_pos * flag_size_, (1 - prob) * 0.51));
				}

				if (prob > 0.0) {
					transition_probabilities_[s][a].push_back(
						State(3 + trap_pos_ * flag_size_, prob * 0.49));
					transition_probabilities_[s][a].push_back(
						State(7 + trap_pos_ * flag_size_, prob * 0.51));
				}
			} else { // Self transition
				transition_probabilities_[s][a].push_back(State(s, 1.0));
			}
		}
	}

	// PrintTransitions();
}